

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O2

QString * checkExecutable(QString *__return_storage_ptr__,QString *path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileInfo info;
  QFileInfo local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo(&local_28,path);
  bVar1 = QFileInfo::isBundle(&local_28);
  if (bVar1) {
    QFileInfo::bundleName(__return_storage_ptr__,&local_28);
  }
  else {
    bVar1 = QFileInfo::isFile(&local_28);
    if (bVar1) {
      bVar1 = QFileInfo::isExecutable(&local_28);
      if (bVar1) {
        QDir::cleanPath(__return_storage_ptr__,path);
        goto LAB_0023b22a;
      }
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
LAB_0023b22a:
  QFileInfo::~QFileInfo(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString checkExecutable(const QString &path)
{
    const QFileInfo info(path);
    if (info.isBundle())
        return info.bundleName();
    if (info.isFile() && info.isExecutable())
        return QDir::cleanPath(path);
    return QString();
}